

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_luma_mode_27_to_33
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < nt) {
    iVar1 = gai4_ihevc_ang_table[mode];
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      uVar3 = iVar1 * (int)uVar2;
      uVar4 = uVar3 & 0x1f;
      uVar5 = 0;
      do {
        lVar6 = (long)(((int)uVar3 >> 5) + nt * 2 + (int)uVar5);
        pu1_dst[uVar5] =
             (UWORD8)((uint)pu1_ref[lVar6 + 1] * (0x20 - uVar4) + pu1_ref[lVar6 + 2] * uVar4 + 0x10
                     >> 5);
        uVar5 = uVar5 + 1;
      } while ((uint)nt != uVar5);
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar2 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_27_to_33(UWORD8 *pu1_ref,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_dst,
                                         WORD32 dst_strd,
                                         WORD32 nt,
                                         WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt, pos, fract;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx;
    UNUSED(src_strd);
    two_nt = 2 * nt;
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < nt; col++)
        {
            ref_main_idx = two_nt + col + idx + 1;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx]
                            + fract * pu1_ref[ref_main_idx + 1] + 16) >> 5);
        }

    }

}